

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O3

bool __thiscall ON_Curve::FrameAt(ON_Curve *this,double t,ON_Plane *plane)

{
  ON_3dVector *b;
  bool bVar1;
  double *pdVar2;
  ON_3dVector K;
  ON_3dVector T;
  ON_3dPoint pt;
  ON_Interval domain;
  ON_3dVector d2;
  ON_3dVector d1;
  ON_3dVector local_c8;
  ON_3dVector local_b0;
  ON_3dPoint local_98;
  ON_Interval local_80;
  ON_3dVector local_70;
  ON_3dVector local_58;
  ON_3dVector local_40;
  
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  pdVar2 = ON_Interval::operator[](&local_80,0);
  if ((((*pdVar2 + -2.220446049250313e-16 <= t) &&
       (pdVar2 = ON_Interval::operator[](&local_80,1), t <= *pdVar2 + 2.220446049250313e-16)) &&
      (bVar1 = Ev2Der(this,t,&local_98,&local_40,&local_58,0,(int *)0x0), bVar1)) &&
     (bVar1 = ON_EvCurvature(&local_40,&local_58,&local_b0,&local_c8), bVar1)) {
    bVar1 = ON_3dVector::Unitize(&local_c8);
    if (!bVar1) {
      ON_3dVector::PerpendicularTo(&local_c8,&local_b0);
      ON_3dVector::Unitize(&local_c8);
    }
    (plane->origin).z = local_98.z;
    (plane->origin).x = local_98.x;
    (plane->origin).y = local_98.y;
    (plane->xaxis).x = local_b0.x;
    (plane->xaxis).y = local_b0.y;
    (plane->xaxis).z = local_b0.z;
    b = &plane->yaxis;
    (plane->yaxis).x = local_c8.x;
    (plane->yaxis).y = local_c8.y;
    (plane->yaxis).z = local_c8.z;
    ON_CrossProduct(&local_70,&plane->xaxis,b);
    (plane->zaxis).z = local_70.z;
    (plane->zaxis).x = local_70.x;
    (plane->zaxis).y = local_70.y;
    bVar1 = ON_3dVector::Unitize(&plane->zaxis);
    if (bVar1) {
      ON_Plane::UpdateEquation(plane);
      bVar1 = ON_Plane::IsValid(plane);
      if (!bVar1) {
        ON_CrossProduct(&local_70,&plane->zaxis,&plane->xaxis);
        (plane->yaxis).z = local_70.z;
        b->x = local_70.x;
        (plane->yaxis).y = local_70.y;
        ON_3dVector::Unitize(b);
        bVar1 = ON_Plane::UpdateEquation(plane);
        return bVar1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Curve::FrameAt( double t, ON_Plane& plane) const
{
  bool rc = false;
  ON_Interval domain = Domain();
  if( t < domain[0] - ON_EPSILON || t > domain[1] + ON_EPSILON)
    return false;

  ON_3dPoint pt;
  ON_3dVector d1, d2;
  rc = Ev2Der( t, pt, d1, d2 );
  if (rc)
  {
    ON_3dVector T, K;
    rc = ON_EvCurvature(d1, d2, T, K);
    if (rc)
    {
      if (!K.Unitize())
      {
        K.PerpendicularTo(T);
        K.Unitize();
      }
      plane.origin = pt;
      plane.xaxis = T;
      plane.yaxis = K;
      plane.zaxis = ON_CrossProduct(plane.xaxis, plane.yaxis);
      if (!plane.zaxis.Unitize())
        return false;
      plane.UpdateEquation();
      rc = plane.IsValid();
      if (!rc)
      {
        //26 Aug 2015 - Chuck - If K is extremely short, but can still be unitized, the result may not be perpendicular to T.
        plane.yaxis = ON_CrossProduct(plane.zaxis, plane.xaxis);
        plane.yaxis.Unitize();
        rc = plane.UpdateEquation();
      }
    }
  }
  return rc;
}